

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::pnm_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::pnm_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *this_00;
  init_policy_type iVar1;
  context *ctx;
  context *ctx_00;
  bool bVar2;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> P;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  rep rVar7;
  long lVar8;
  long lVar9;
  random_engine *rng;
  int iVar10;
  pnm_observer *x_optimistic;
  pnm_observer *x_pessimistic;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar13;
  double dVar14;
  double dVar15;
  string_view filename;
  compute_order compute;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  slv;
  pnm_observer obs;
  longdouble local_428;
  undefined1 local_410 [28];
  longdouble local_3f4;
  default_cost_type<long_double> *local_3e8;
  double local_3e0;
  int local_3d8;
  longdouble local_3d4;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  cost_type local_3b8;
  longdouble local_3a4;
  longdouble local_398;
  longdouble local_38c;
  long local_380;
  double local_378;
  double local_370;
  compute_order local_368;
  longdouble local_330;
  longdouble local_324;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  local_318;
  pnm_observer local_288;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_410._16_8_ = __return_storage_ptr__;
  local_3e0 = cost_constant;
  bit_array_impl::bit_array_impl((bit_array_impl *)local_410,variables);
  ctx = this->m_ctx;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)&local_3b8,ctx,original_costs,this->m_rng,variables);
  local_398 = (longdouble)(ctx->parameters).kappa_step;
  local_38c = (longdouble)(ctx->parameters).kappa_max;
  local_3a4 = (longdouble)(ctx->parameters).alpha;
  local_3f4 = (longdouble)(ctx->parameters).theta;
  dVar15 = (ctx->parameters).delta;
  if (0.0 <= dVar15) {
    local_3d4 = (longdouble)dVar15;
    local_370 = dVar15;
  }
  else {
    ctx_00 = this->m_ctx;
    local_288.m_pi_obs._0_8_ = SUB108(local_3f4,0);
    local_288.m_pi_obs.m_pnm.m_buffer._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_2_ =
         (undefined2)((unkuint10)local_3f4 >> 0x40);
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    local_318._0_10_ = _DAT_0062a0d0;
    if (variables != 0) {
      lVar9 = 0;
      do {
        lVar13 = *(longdouble *)
                  ((long)local_3b8.linear_elements._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar9);
        lVar11 = ABS(lVar13);
        lVar12 = (longdouble)local_318._0_10_;
        if (lVar11 <= (longdouble)local_318._0_10_ || (longdouble)local_318._0_10_ != lVar11) {
          lVar12 = lVar11;
        }
        if ((longdouble)0 != lVar13) {
          local_318._0_10_ = lVar12;
        }
        if (NAN((longdouble)0) || NAN(lVar13)) {
          local_318._0_10_ = lVar12;
        }
        lVar9 = lVar9 + 0x10;
        in_ST3 = in_ST2;
        in_ST4 = in_ST2;
        in_ST5 = in_ST2;
      } while ((ulong)(uint)variables << 4 != lVar9);
    }
    local_368.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = (longdouble)local_318._0_10_ - local_3f4 * (longdouble)local_318._0_10_;
    info<long_double,long_double,long_double>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",
               (longdouble *)&local_368,(longdouble *)&local_318,(longdouble *)&local_288);
    local_3d4 = (longdouble)
                local_368.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._0_10_;
  }
  local_324 = (longdouble)(ctx->parameters).pushing_k_factor;
  local_330 = (longdouble)(ctx->parameters).pushing_objective_amplifier;
  local_380 = (long)(ctx->parameters).w;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::solver_inequalities_101coeff
            (&local_318,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_3b8,constraints);
  compute_order::compute_order(&local_368,(ctx->parameters).order,variables);
  dVar15 = (this->m_ctx->parameters).init_policy_random;
  local_288.m_pi_obs.constraints = 0;
  local_288.m_pi_obs._4_4_ = 0;
  local_288.m_pi_obs.m_pnm.m_buffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_2_ = 0;
  local_288.m_pi_obs.m_pnm.m_buffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._2_6_ = 0;
  iVar1 = (ctx->parameters).init_policy;
  local_3d8 = variables;
  if (iVar1 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)local_410,original_costs,variables,0);
  }
  else {
    if (iVar1 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = (pnm_observer *)local_410;
      x_optimistic = &local_288;
    }
    else {
      if (iVar1 != optimistic_solve) goto LAB_004b2bf2;
      rng = this->m_rng;
      x_pessimistic = &local_288;
      x_optimistic = (pnm_observer *)local_410;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_004b2bf2:
  local_3e8 = original_costs;
  if (local_410._0_4_ != 0) {
    iVar10 = 0;
    do {
      dVar14 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar14 < dVar15) {
        bit_array_impl::invert((bit_array_impl *)local_410,iVar10);
      }
      iVar10 = iVar10 + 1;
    } while (local_410._0_4_ != iVar10);
  }
  if ((void *)CONCAT62(local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._2_6_,
                       local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_2_) !=
      (void *)0x0) {
    operator_delete__((void *)CONCAT62(local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl.
                                       _2_6_,local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                             .super__Head_base<0UL,_unsigned_char_*,_false>.
                                             _M_head_impl._0_2_));
  }
  dVar15 = (ctx->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  pnm_observer::pnm_observer(&local_288,filename,local_318.m,local_318.n,(ctx->parameters).limit);
  local_428 = (longdouble)dVar15;
  local_378 = dVar15;
  rVar7 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar7;
  rVar7 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar7;
  compute_order::
  init<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
            (&local_368,&local_318,(bit_array *)local_410);
  if ((ctx->parameters).limit != 0) {
    iVar10 = 0x7fffffff;
    lVar9 = 0;
    while( true ) {
      iVar4 = compute_order::
              run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                        (&local_368,&local_318,(bit_array *)local_410,this->m_rng,local_428,
                         local_3d4,local_3f4);
      uVar3._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)
           local_318.pi;
      P._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)local_318.P
      ;
      details::pi_pnm_observer::make_observation<long_double>
                (&local_288.m_pi_obs,&local_318.ap,
                 (longdouble *)
                 local_318.P._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl,
                 (longdouble *)
                 local_318.pi._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
      details::ap_pnm_observer::make_observation<long_double>
                (&local_288.m_ap_obs,&local_318.ap,
                 (longdouble *)
                 P._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t
                 .super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl,
                 (longdouble *)
                 uVar3._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
      if (iVar4 == 0) {
        dVar15 = default_cost_type<long_double>::results(local_3e8,(bit_array *)local_410,local_3e0)
        ;
        store_if_better(this,(bit_array *)local_410,dVar15,lVar9);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_004b2e3d;
        iVar10 = 0;
        iVar4 = 0;
        goto LAB_004b2f8d;
      }
      if (iVar4 < iVar10) {
        store_if_better(this,(bit_array *)local_410,iVar4,lVar9);
        iVar10 = iVar4;
      }
      if (local_380 < lVar9) {
        local_3bc = local_318.m;
        local_3c0 = iVar4;
        powl();
        local_428 = local_428 + local_398 * in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      if (local_38c < local_428) break;
      in_ST5 = in_ST4;
      lVar8 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar8;
      dVar15 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar15) && (dVar15 < (double)(lVar8 - (this->m_begin).__d.__r) / 1000000000.0)) ||
         (lVar9 = lVar9 + 1, lVar9 == (ctx->parameters).limit)) break;
    }
  }
  *(result_status *)(local_410._16_8_ + 0xa0) = limit_reached;
LAB_004b2e3d:
  iVar10 = local_3d8;
  if ((this->m_best).remaining_constraints == 0) {
    *(result_status *)(local_410._16_8_ + 0xa0) = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    this_00 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
              (local_410._16_8_ + 0x68);
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(this_00,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (this_00->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
               )._M_impl.super__Vector_impl_data._M_start,iVar10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_ap_obs.m_basename._M_dataplus._M_p != &local_288.m_ap_obs.m_basename.field_2) {
    operator_delete(local_288.m_ap_obs.m_basename._M_dataplus._M_p,
                    local_288.m_ap_obs.m_basename.field_2._M_allocated_capacity + 1);
  }
  pnm_vector::~pnm_vector(&local_288.m_pi_obs.m_pnm);
  if (local_368.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_368.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_368.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_368.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::~solver_inequalities_101coeff(&local_318);
  if ((_Head_base<0UL,_long_double_*,_false>)
      local_3b8.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl !=
      (_Head_base<0UL,_long_double_*,_false>)0x0) {
    operator_delete__((void *)local_3b8.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if ((unsigned_long *)local_410._8_8_ != (unsigned_long *)0x0) {
    operator_delete__((void *)local_410._8_8_);
  }
  return (result *)local_410._16_8_;
LAB_004b2f8d:
  do {
    lVar13 = in_ST4;
    iVar5 = compute_order::
            push_and_run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                      (&local_368,&local_318,(bit_array *)local_410,this->m_rng,
                       local_324 * local_428,local_3d4,local_3f4,local_330);
    if (iVar5 == 0) {
      dVar15 = default_cost_type<long_double>::results(local_3e8,(bit_array *)local_410,local_3e0);
      store_if_better(this,(bit_array *)local_410,dVar15,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar4));
    }
    lVar9 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar9;
    dVar15 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar15) && (dVar15 < (double)(lVar9 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar5 = 1;
      while (iVar6 = compute_order::
                     run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                               (&local_368,&local_318,(bit_array *)local_410,this->m_rng,local_428,
                                local_3d4,local_3f4), iVar6 != 0) {
        if ((ctx->parameters).w < (double)(iVar5 + -1)) {
          local_3c4 = local_318.m;
          lVar12 = lVar13;
          local_3c8 = iVar6;
          powl();
          local_428 = local_428 + local_398 * in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = lVar13;
          lVar13 = lVar12;
        }
        if (local_38c < local_428) goto LAB_004b31ad;
        lVar9 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar9;
        dVar15 = (this->m_ctx->parameters).time_limit;
        if (((0.0 < dVar15) && (dVar15 < (double)(lVar9 - (this->m_begin).__d.__r) / 1000000000.0))
           || (bVar2 = (ctx->parameters).pushing_iteration_limit <= iVar5, iVar5 = iVar5 + 1, bVar2)
           ) goto LAB_004b31ad;
      }
      dVar15 = default_cost_type<long_double>::results(local_3e8,(bit_array *)local_410,local_3e0);
      store_if_better(this,(bit_array *)local_410,dVar15,
                      (long)((ctx->parameters).pushing_iteration_limit * iVar10 - iVar5));
    }
LAB_004b31ad:
    iVar4 = iVar4 + 1;
    iVar10 = iVar10 + -1;
  } while (iVar4 < (ctx->parameters).pushes_limit);
  goto LAB_004b2e3d;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }